

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
visit_double(typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this,
            double value,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  ulong local_8;
  
  local_8 = (long)(value - 9.223372036854776e+18) & (long)value >> 0x3f | (long)value;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (this->v_,&local_8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }